

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAddApply.c
# Opt level: O3

DdNode * Cudd_addOneZeroMaximum(DdManager *dd,DdNode **f,DdNode **g)

{
  DdNode *pDVar1;
  DdNode *pDVar2;
  long lVar3;
  
  pDVar1 = *f;
  pDVar2 = *g;
  lVar3 = 0x30;
  if ((pDVar1 != pDVar2) && (pDVar2 != dd->plusinfinity)) {
    if ((pDVar1->index != 0x7fffffff) || (pDVar2->index != 0x7fffffff)) {
      return (DdNode *)0x0;
    }
    lVar3 = (ulong)((pDVar1->type).value < (pDVar2->type).value ||
                   (pDVar1->type).value == (pDVar2->type).value) * 8 + 0x28;
  }
  return *(DdNode **)((long)&(dd->sentinel).index + lVar3);
}

Assistant:

DdNode *
Cudd_addOneZeroMaximum(
  DdManager * dd,
  DdNode ** f,
  DdNode ** g)
{

    if (*f == *g) return(DD_ZERO(dd));
    if (*g == DD_PLUS_INFINITY(dd))
        return DD_ZERO(dd);
    if (cuddIsConstant(*f) && cuddIsConstant(*g)) {
        if (cuddV(*f) > cuddV(*g)) {
            return(DD_ONE(dd));
        } else {
            return(DD_ZERO(dd));
        }
    }

    return(NULL);

}